

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorBase.cpp
# Opt level: O2

void __thiscall
pele::physics::reactions::ReactorBase::set_sundials_solver_tols
          (ReactorBase *this,Context *sunctx,void *sundials_mem,int ncells,Real relTol,Real absTol,
          string *solvername)

{
  bool bVar1;
  int iVar2;
  N_Vector v;
  realtype *prVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  uint length;
  ulong uVar7;
  int flag;
  ostream local_1a8 [376];
  
  length = ncells * 0x16;
  v = N_VNew_Serial(length,*(sunctx->sunctx_)._M_t.
                            super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                            ._M_t.
                            super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                            .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
  prVar3 = N_VGetArrayPointer(v);
  if ((this->m_typ_vals)._M_elems[0] <= 0.0) {
    if (0 < this->verbose) {
      poVar4 = amrex::OutStream();
      amrex::Print::Print((Print *)&flag,poVar4);
      std::operator<<(local_1a8," Setting ");
      std::operator<<(local_1a8,(string *)solvername);
      std::operator<<(local_1a8," tolerances rtol = ");
      std::ostream::_M_insert<double>(relTol);
      std::operator<<(local_1a8," atol = ");
      std::ostream::_M_insert<double>(absTol);
      std::operator<<(local_1a8," in PelePhysics \n");
      amrex::Print::~Print((Print *)&flag);
    }
    uVar5 = 0;
    uVar7 = (ulong)length;
    if ((int)length < 1) {
      uVar7 = uVar5;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      prVar3[uVar5] = absTol;
    }
  }
  else {
    if (0 < this->verbose) {
      poVar4 = amrex::OutStream();
      amrex::Print::Print((Print *)&flag,poVar4);
      std::operator<<(local_1a8," Setting ");
      std::operator<<(local_1a8,(string *)solvername);
      std::operator<<(local_1a8," tolerances with TypVals rtol = ");
      std::ostream::_M_insert<double>(relTol);
      std::operator<<(local_1a8," atolfact = ");
      std::ostream::_M_insert<double>(absTol);
      std::operator<<(local_1a8," in PelePhysics \n");
      amrex::Print::~Print((Print *)&flag);
    }
    uVar5 = 0;
    uVar7 = (ulong)(uint)ncells;
    if (ncells < 1) {
      uVar7 = uVar5;
    }
    for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
      for (lVar6 = 0; lVar6 != 0x16; lVar6 = lVar6 + 1) {
        prVar3[lVar6] = (this->m_typ_vals)._M_elems[lVar6] * absTol;
      }
      prVar3 = prVar3 + 0x16;
    }
  }
  bVar1 = std::operator==(solvername,"cvode");
  if (bVar1) {
    flag = CVodeSVtolerances(sundials_mem,relTol,v);
  }
  else {
    bVar1 = std::operator==(solvername,"arkstep");
    if (bVar1) {
      flag = ARKStepSVtolerances(sundials_mem,relTol,v);
    }
    else {
      bVar1 = std::operator==(solvername,"erkstep");
      if (bVar1) {
        flag = ERKStepSVtolerances(sundials_mem,relTol,v);
      }
      else {
        amrex::Abort_host("setSundialsSolverTols not implemented for this solver type");
      }
    }
  }
  iVar2 = utils::check_flag(&flag,"SVtolerances",1);
  if (iVar2 != 0) {
    amrex::Abort_host("Problem in setSundialsSolverTols");
  }
  N_VDestroy(v);
  return;
}

Assistant:

void
ReactorBase::set_sundials_solver_tols(
  // cppcheck-suppress constParameter
  sundials::Context& sunctx,
  void* sundials_mem,
  const int ncells,
  const amrex::Real relTol,
  const amrex::Real absTol,
  const std::string& solvername)
{
  int omp_thread = 0;
#ifdef AMREX_USE_OMP
  omp_thread = omp_get_thread_num();
#endif

  const int neq_tot = (NUM_SPECIES + 1) * ncells;

#if defined(AMREX_USE_CUDA)
  N_Vector atol = N_VNewWithMemHelp_Cuda(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Cuda(atol);
#elif defined(AMREX_USE_HIP)
  N_Vector atol = N_VNewWithMemHelp_Hip(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Hip(atol);
#elif defined(AMREX_USE_DPCPP)
  N_Vector atol = N_VNewWithMemHelp_Sycl(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(),
    &amrex::Gpu::Device::streamQueue(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Sycl(atol);
#else
  N_Vector atol = N_VNew_Serial(neq_tot, sunctx);
  amrex::Real* ratol = N_VGetArrayPointer(atol);
#endif

  if (m_typ_vals[0] > 0.0) {
    // cppcheck-suppress knownConditionTrueFalse
    if ((verbose > 0) && (omp_thread == 0)) {
      amrex::Print() << " Setting " << solvername
                     << " tolerances with TypVals rtol = " << relTol
                     << " atolfact = " << absTol << " in PelePhysics \n";
    }
    for (int i = 0; i < ncells; i++) {
      const int offset = i * (NUM_SPECIES + 1);
      for (int k = 0; k < NUM_SPECIES + 1; k++) {
        ratol[offset + k] = m_typ_vals[k] * absTol;
      }
    }
  } else {
    // cppcheck-suppress knownConditionTrueFalse
    if ((verbose > 0) && (omp_thread == 0)) {
      amrex::Print() << " Setting " << solvername
                     << " tolerances rtol = " << relTol << " atol = " << absTol
                     << " in PelePhysics \n";
    }
    for (int i = 0; i < neq_tot; i++) {
      ratol[i] = absTol;
    }
  }

#if defined(AMREX_USE_CUDA)
  N_VCopyToDevice_Cuda(atol);
#elif defined(AMREX_USE_HIP)
  N_VCopyToDevice_Hip(atol);
#elif defined(AMREX_USE_DPCPP)
  N_VCopyToDevice_Sycl(atol);
#endif

  // Call CVodeSVtolerances to specify the scalar relative tolerance
  // and vector absolute tolerances
  int flag;
  if (solvername == "cvode") {
    flag = CVodeSVtolerances(sundials_mem, relTol, atol);
  } else if (solvername == "arkstep") {
    flag = ARKStepSVtolerances(sundials_mem, relTol, atol);
  } else if (solvername == "erkstep") {
    flag = ERKStepSVtolerances(sundials_mem, relTol, atol);
  } else {
    amrex::Abort("setSundialsSolverTols not implemented for this solver type");
  }
  if (utils::check_flag(&flag, "SVtolerances", 1) != 0) {
    amrex::Abort("Problem in setSundialsSolverTols");
  }

  N_VDestroy(atol);
}